

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O2

int pk_parse_key_pkcs1_der(mbedtls_rsa_context *rsa,uchar *key,size_t keylen)

{
  int iVar1;
  uint uVar2;
  uchar *end;
  uchar *p;
  size_t len;
  int version;
  mbedtls_mpi T;
  
  mbedtls_mpi_init(&T);
  p = key;
  iVar1 = mbedtls_asn1_get_tag(&p,key + keylen,&len,0x30);
  if (iVar1 == 0) {
    end = p + len;
    iVar1 = mbedtls_asn1_get_int(&p,end,&version);
    if (iVar1 == 0) {
      if (version != 0) {
        return -0x3d80;
      }
      uVar2 = mbedtls_asn1_get_tag(&p,end,&len,2);
      if ((uVar2 == 0) &&
         (uVar2 = mbedtls_rsa_import_raw
                            (rsa,p,len,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0),
         uVar2 == 0)) {
        p = p + len;
        uVar2 = mbedtls_asn1_get_tag(&p,end,&len,2);
        if ((uVar2 == 0) &&
           (uVar2 = mbedtls_rsa_import_raw
                              (rsa,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,p,len
                              ), uVar2 == 0)) {
          p = p + len;
          uVar2 = mbedtls_asn1_get_tag(&p,end,&len,2);
          if ((uVar2 == 0) &&
             (uVar2 = mbedtls_rsa_import_raw
                                (rsa,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,p,len,(uchar *)0x0
                                 ,0), uVar2 == 0)) {
            p = p + len;
            uVar2 = mbedtls_asn1_get_tag(&p,end,&len,2);
            if ((uVar2 == 0) &&
               (uVar2 = mbedtls_rsa_import_raw
                                  (rsa,(uchar *)0x0,0,p,len,(uchar *)0x0,0,(uchar *)0x0,0,
                                   (uchar *)0x0,0), uVar2 == 0)) {
              p = p + len;
              uVar2 = mbedtls_asn1_get_tag(&p,end,&len,2);
              if ((uVar2 == 0) &&
                 (uVar2 = mbedtls_rsa_import_raw
                                    (rsa,(uchar *)0x0,0,(uchar *)0x0,0,p,len,(uchar *)0x0,0,
                                     (uchar *)0x0,0), uVar2 == 0)) {
                p = p + len;
                uVar2 = mbedtls_rsa_complete(rsa);
                if ((uVar2 == 0) &&
                   (((uVar2 = mbedtls_asn1_get_mpi(&p,end,&T), uVar2 == 0 &&
                     (uVar2 = mbedtls_asn1_get_mpi(&p,end,&T), uVar2 == 0)) &&
                    (uVar2 = mbedtls_asn1_get_mpi(&p,end,&T), uVar2 == 0)))) {
                  uVar2 = 0xffffc29a;
                  if (p == end) {
                    uVar2 = 0;
                  }
                }
              }
            }
          }
        }
      }
      mbedtls_mpi_free(&T);
      if (uVar2 != 0) {
        iVar1 = uVar2 - 0x3d00;
        if ((uVar2 & 0xff80) != 0) {
          iVar1 = -0x3d00;
        }
        mbedtls_rsa_free(rsa);
        return iVar1;
      }
      return 0;
    }
  }
  return iVar1 + -0x3d00;
}

Assistant:

static int pk_parse_key_pkcs1_der( mbedtls_rsa_context *rsa,
                                   const unsigned char *key,
                                   size_t keylen )
{
    int ret, version;
    size_t len;
    unsigned char *p, *end;

    mbedtls_mpi T;
    mbedtls_mpi_init( &T );

    p = (unsigned char *) key;
    end = p + keylen;

    /*
     * This function parses the RSAPrivateKey (PKCS#1)
     *
     *  RSAPrivateKey ::= SEQUENCE {
     *      version           Version,
     *      modulus           INTEGER,  -- n
     *      publicExponent    INTEGER,  -- e
     *      privateExponent   INTEGER,  -- d
     *      prime1            INTEGER,  -- p
     *      prime2            INTEGER,  -- q
     *      exponent1         INTEGER,  -- d mod (p-1)
     *      exponent2         INTEGER,  -- d mod (q-1)
     *      coefficient       INTEGER,  -- (inverse of q) mod p
     *      otherPrimeInfos   OtherPrimeInfos OPTIONAL
     *  }
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    end = p + len;

    if( ( ret = mbedtls_asn1_get_int( &p, end, &version ) ) != 0 )
    {
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    if( version != 0 )
    {
        return( MBEDTLS_ERR_PK_KEY_INVALID_VERSION );
    }

    /* Import N */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
                                      MBEDTLS_ASN1_INTEGER ) ) != 0 ||
        ( ret = mbedtls_rsa_import_raw( rsa, p, len, NULL, 0, NULL, 0,
                                        NULL, 0, NULL, 0 ) ) != 0 )
        goto cleanup;
    p += len;

    /* Import E */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
                                      MBEDTLS_ASN1_INTEGER ) ) != 0 ||
        ( ret = mbedtls_rsa_import_raw( rsa, NULL, 0, NULL, 0, NULL, 0,
                                        NULL, 0, p, len ) ) != 0 )
        goto cleanup;
    p += len;

    /* Import D */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
                                      MBEDTLS_ASN1_INTEGER ) ) != 0 ||
        ( ret = mbedtls_rsa_import_raw( rsa, NULL, 0, NULL, 0, NULL, 0,
                                        p, len, NULL, 0 ) ) != 0 )
        goto cleanup;
    p += len;

    /* Import P */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
                                      MBEDTLS_ASN1_INTEGER ) ) != 0 ||
        ( ret = mbedtls_rsa_import_raw( rsa, NULL, 0, p, len, NULL, 0,
                                        NULL, 0, NULL, 0 ) ) != 0 )
        goto cleanup;
    p += len;

    /* Import Q */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
                                      MBEDTLS_ASN1_INTEGER ) ) != 0 ||
        ( ret = mbedtls_rsa_import_raw( rsa, NULL, 0, NULL, 0, p, len,
                                        NULL, 0, NULL, 0 ) ) != 0 )
        goto cleanup;
    p += len;

    /* Complete the RSA private key */
    if( ( ret = mbedtls_rsa_complete( rsa ) ) != 0 )
        goto cleanup;

    /* Check optional parameters */
    if( ( ret = mbedtls_asn1_get_mpi( &p, end, &T ) ) != 0 ||
        ( ret = mbedtls_asn1_get_mpi( &p, end, &T ) ) != 0 ||
        ( ret = mbedtls_asn1_get_mpi( &p, end, &T ) ) != 0 )
        goto cleanup;

    if( p != end )
    {
        ret = MBEDTLS_ERR_PK_KEY_INVALID_FORMAT +
              MBEDTLS_ERR_ASN1_LENGTH_MISMATCH ;
    }

cleanup:

    mbedtls_mpi_free( &T );

    if( ret != 0 )
    {
        /* Wrap error code if it's coming from a lower level */
        if( ( ret & 0xff80 ) == 0 )
            ret = MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret;
        else
            ret = MBEDTLS_ERR_PK_KEY_INVALID_FORMAT;

        mbedtls_rsa_free( rsa );
    }

    return( ret );
}